

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O2

void __thiscall polyscope::SurfaceCountQuantity::buildCustomUI(SurfaceCountQuantity *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cm;
  bool bVar1;
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_60,"##colormap_picker",&local_61);
  cm = &(this->colorMap).value;
  bVar1 = render::buildColormapSelector(cm,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::manuallyChanged(&this->colorMap);
    std::__cxx11::string::string((string *)&local_40,(string *)cm);
    setColorMap(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->program).
                super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>);
  }
  ImGui::Text("Sum: %d",(ulong)(uint)this->sum);
  ImGui::DragFloatRange2
            ("Color Range",&this->vizRangeLow,&this->vizRangeHigh,
             (this->dataRangeHigh - this->dataRangeLow) / 100.0,this->dataRangeLow,
             this->dataRangeHigh,"Min: %.3e","Max: %.3e",1.0);
  bVar1 = ImGui::SliderFloat("Radius",&(this->pointRadius).value.value,0.0,0.1,"%.5f",3.0);
  if (bVar1) {
    PersistentValue<polyscope::ScaledValue<float>_>::manuallyChanged(&this->pointRadius);
    requestRedraw();
  }
  return;
}

Assistant:

void SurfaceCountQuantity::buildCustomUI() {

  if (render::buildColormapSelector(colorMap.get())) {
    colorMap.manuallyChanged();
    setColorMap(colorMap.get());
    program.reset();
  }
  ImGui::Text("Sum: %d", sum);

  ImGui::DragFloatRange2("Color Range", &vizRangeLow, &vizRangeHigh, (dataRangeHigh - dataRangeLow) / 100.,
                         dataRangeLow, dataRangeHigh, "Min: %.3e", "Max: %.3e");

  if (ImGui::SliderFloat("Radius", pointRadius.get().getValuePtr(), 0.0, .1, "%.5f", 3.)) {
    pointRadius.manuallyChanged();
    requestRedraw();
  }
}